

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t priv_init_scratch(exr_context_t ctxt,_internal_exr_seq_scratch *scr,uint64_t offset)

{
  long lVar1;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  exr_result_t local_4;
  
  in_RSI[1] = 0;
  in_RSI[2] = 0;
  in_RSI[3] = in_RDX;
  in_RSI[4] = (long)scratch_seq_read;
  in_RSI[5] = (long)scratch_seq_skip;
  in_RSI[6] = in_RDI;
  lVar1 = (**(code **)(in_RDI + 0x58))(0x1000);
  *in_RSI = lVar1;
  if (*in_RSI == 0) {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static exr_result_t
priv_init_scratch (
    exr_context_t ctxt, struct _internal_exr_seq_scratch* scr, uint64_t offset)
{
    scr->curpos          = 0;
    scr->navail          = 0;
    scr->fileoff         = offset;
    scr->sequential_read = &scratch_seq_read;
    scr->sequential_skip = &scratch_seq_skip;
    scr->ctxt            = ctxt;
    scr->scratch         = ctxt->alloc_fn (SCRATCH_BUFFER_SIZE);
    if (scr->scratch == NULL)
        return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
    return EXR_ERR_SUCCESS;
}